

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O3

void __thiscall
jetbrains::teamcity::TeamcityMessages::testStarted
          (TeamcityMessages *this,string *name,string *flowId,bool captureStandardOutput)

{
  pointer pcVar1;
  string value;
  RaiiMessage msg;
  RaiiMessage in_stack_ffffffffffffff78;
  RaiiMessage RVar2;
  char *name_00;
  undefined8 in_stack_ffffffffffffff88;
  long in_stack_ffffffffffffff90;
  string local_60;
  string local_40;
  
  anon_unknown_1::RaiiMessage::RaiiMessage
            ((RaiiMessage *)&stack0xffffffffffffff78,"testStarted",this->m_out);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + name->_M_string_length);
  RVar2.m_out = in_stack_ffffffffffffff78.m_out;
  anon_unknown_1::RaiiMessage::writeProperty
            ((RaiiMessage *)in_stack_ffffffffffffff78.m_out,"name",&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (flowId->_M_dataplus)._M_p;
  name_00 = &stack0xffffffffffffff90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff80,pcVar1,pcVar1 + flowId->_M_string_length);
  value._M_string_length = (size_type)name_00;
  value._M_dataplus._M_p = (pointer)RVar2.m_out;
  value.field_2._M_allocated_capacity = in_stack_ffffffffffffff88;
  value.field_2._8_8_ = in_stack_ffffffffffffff90;
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty
            ((RaiiMessage *)&stack0xffffffffffffff78,name_00,value);
  if (name_00 != &stack0xffffffffffffff90) {
    operator_delete(name_00,in_stack_ffffffffffffff90 + 1);
  }
  if (captureStandardOutput) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"true","");
    anon_unknown_1::RaiiMessage::writeProperty
              ((RaiiMessage *)in_stack_ffffffffffffff78.m_out,"captureStandardOutput",&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  anon_unknown_1::RaiiMessage::~RaiiMessage((RaiiMessage *)in_stack_ffffffffffffff78.m_out);
  return;
}

Assistant:

void TeamcityMessages::testStarted(const std::string& name, const std::string& flowId, const bool captureStandardOutput)
{
    RaiiMessage msg("testStarted", *m_out);
    msg.writeProperty("name", name);
    msg.writePropertyIfNonEmpty("flowId", flowId);

    if (captureStandardOutput)
        msg.writeProperty("captureStandardOutput", "true"); // false by default
}